

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::fromLatin1(QString *__return_storage_ptr__,QString *this,QByteArrayView ba)

{
  char16_t *dst;
  QArrayData *pQVar1;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char *)ba.m_size == (char *)0x0) {
    dst = (char16_t *)0x0;
  }
  else {
    if (this != (QString *)0x0) {
      local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      dst = (char16_t *)QArrayData::allocate2(&local_38,(qsizetype)this,KeepSize);
      pQVar1 = local_38;
      dst[(long)this] = L'\0';
      qt_from_latin1(dst,(char *)ba.m_size,(size_t)this);
      goto LAB_001218fa;
    }
    dst = L"";
  }
  this = (QString *)0x0;
  pQVar1 = (QArrayData *)0x0;
LAB_001218fa:
  (__return_storage_ptr__->d).d = (Data *)pQVar1;
  (__return_storage_ptr__->d).ptr = dst;
  (__return_storage_ptr__->d).size = (qsizetype)this;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromLatin1(QByteArrayView ba)
{
    DataPointer d;
    if (!ba.data()) {
        // nothing to do
    } else if (ba.size() == 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(ba.size(), ba.size());
        Q_CHECK_PTR(d.data());
        d.data()[ba.size()] = '\0';
        char16_t *dst = d.data();

        qt_from_latin1(dst, ba.data(), size_t(ba.size()));
    }
    return QString(std::move(d));
}